

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Welcome.cpp
# Opt level: O2

void Handlers::Welcome_Msg(Player *player,PacketReader *reader)

{
  byte bVar1;
  World *pWVar2;
  pointer pcVar3;
  Character *pCVar4;
  NPC *pNVar5;
  pointer psVar6;
  pointer ppCVar7;
  uchar x;
  uchar y;
  bool bVar8;
  short sVar9;
  int iVar10;
  Map *pMVar11;
  mapped_type *this;
  FILE *__stream;
  char *pcVar12;
  ulong uVar13;
  list<Character_*,_std::allocator<Character_*>_> *plVar14;
  pointer ppNVar15;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar16;
  list<Character_Item,_std::allocator<Character_Item>_> *plVar17;
  list<Character_Spell,_std::allocator<Character_Spell>_> *plVar18;
  pointer ppNVar19;
  pointer ppCVar20;
  _List_node_base *p_Var21;
  long lVar22;
  __shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *p_Var23;
  allocator<char> local_1129;
  string str;
  PacketBuilder reply;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  string news_file;
  string local_1058;
  char newsbuf [4096];
  
  PacketReader::GetThree(reader);
  PacketReader::GetInt(reader);
  pMVar11 = World::GetMap(player->character->world,player->character->mapid);
  if (pMVar11->exists == false) {
    pWVar2 = player->character->world;
    sVar9 = Character::SpawnMap(player->character);
    pMVar11 = World::GetMap(pWVar2,sVar9);
    pcVar3 = (player->character->real_name)._M_dataplus._M_p;
    uVar13 = (ulong)(uint)(int)player->character->mapid;
    if (pMVar11->exists != true) {
      Console::Wrn("Player logged in to non-existent map (%s, map %i) - Disconnected",pcVar3,uVar13)
      ;
      Client::Close(&player->client->super_Client,false);
      return;
    }
    Console::Wrn("Player logged in to non-existent map (%s, map %i) - Position reset",pcVar3,uVar13)
    ;
    pCVar4 = player->character;
    sVar9 = Character::SpawnMap(pCVar4);
    x = Character::SpawnX(player->character);
    y = Character::SpawnY(player->character);
    Character::Warp(pCVar4,sVar9,x,y,WARP_ANIMATION_NONE);
  }
  World::Login(player->world,player->character);
  player->client->state = Playing;
  updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  updateitems.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  updateitems.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  updateitems.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar14 = &player->character->map->characters;
  p_Var21 = (_List_node_base *)plVar14;
  while (p_Var21 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var21->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var21 != (_List_node_base *)plVar14) {
    newsbuf._0_8_ = p_Var21[1]._M_next;
    bVar8 = Character::InRange(player->character,(Character *)newsbuf._0_8_);
    if (bVar8) {
      std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                (&updatecharacters,(value_type *)newsbuf);
    }
  }
  pMVar11 = player->character->map;
  ppNVar19 = (pMVar11->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppNVar15 = (pMVar11->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppNVar15 != ppNVar19; ppNVar15 = ppNVar15 + 1) {
    newsbuf._0_8_ = *ppNVar15;
    bVar8 = Character::InRange(player->character,(NPC *)newsbuf._0_8_);
    if (bVar8) {
      std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back(&updatenpcs,(value_type *)newsbuf);
    }
  }
  plVar16 = &player->character->map->items;
  p_Var21 = (_List_node_base *)plVar16;
  while (p_Var21 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var21 != (_List_node_base *)plVar16) {
    std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)newsbuf,
               (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(p_Var21 + 1));
    bVar8 = Character::InRange(player->character,(Map_Item *)newsbuf._0_8_);
    if (bVar8) {
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::push_back
                (&updateitems,(value_type *)newsbuf);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(newsbuf + 8));
  }
  PacketBuilder::PacketBuilder(&reply,PACKET_WELCOME,PACKET_REPLY,0xc);
  PacketBuilder::AddShort(&reply,2);
  PacketBuilder::AddByte(&reply,0xff);
  pWVar2 = player->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)newsbuf,"NewsFile",(allocator<char> *)&str);
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar2->config,(key_type *)newsbuf);
  util::variant::GetString_abi_cxx11_(&news_file,this);
  std::__cxx11::string::~string((string *)newsbuf);
  memset(newsbuf,0,0x1000);
  __stream = fopen(news_file._M_dataplus._M_p,"rt");
  bVar8 = __stream == (FILE *)0x0;
  if (bVar8) {
    Console::Wrn("Could not load news file \'%s\'",news_file._M_dataplus._M_p);
  }
  lVar22 = 0;
  do {
    if (lVar22 == 9) {
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      PacketBuilder::ReserveMore
                (&reply,((long)updatecharacters.
                               super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)updatecharacters.
                               super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                               .super__Vector_impl_data._M_start >> 3) * 0x3c +
                        (player->character->spells).
                        super__List_base<Character_Spell,_std::allocator<Character_Spell>_>._M_impl.
                        _M_node._M_size * 4 +
                        (((long)updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl
                                .super__Vector_impl_data._M_start >> 3) +
                        (player->character->inventory).
                        super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                        _M_node._M_size) * 6 +
                        ((long)updateitems.
                               super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)updateitems.
                               super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 7);
      PacketBuilder::AddChar(&reply,player->character->weight);
      PacketBuilder::AddChar(&reply,player->character->maxweight);
      plVar17 = &player->character->inventory;
      p_Var21 = (_List_node_base *)plVar17;
      while (p_Var21 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                        &p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var21 != (_List_node_base *)plVar17) {
        iVar10 = *(int *)((long)&p_Var21[1]._M_next + 4);
        PacketBuilder::AddShort(&reply,(int)*(short *)&p_Var21[1]._M_next);
        PacketBuilder::AddInt(&reply,iVar10);
      }
      PacketBuilder::AddByte(&reply,0xff);
      plVar18 = &player->character->spells;
      p_Var21 = (_List_node_base *)plVar18;
      while (p_Var21 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                        &p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var21 != (_List_node_base *)plVar18) {
        bVar1 = *(undefined1 *)((long)&p_Var21[1]._M_next + 2);
        PacketBuilder::AddShort(&reply,(int)*(short *)&p_Var21[1]._M_next);
        PacketBuilder::AddShort(&reply,(uint)bVar1);
      }
      PacketBuilder::AddByte(&reply,0xff);
      PacketBuilder::AddChar
                (&reply,(int)((ulong)((long)updatecharacters.
                                            super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)updatecharacters.
                                           super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
      PacketBuilder::AddByte(&reply,0xff);
      ppCVar7 = updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar20 = updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppNVar15 = updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                     super__Vector_impl_data._M_finish, ppCVar20 != ppCVar7; ppCVar20 = ppCVar20 + 1
          ) {
        pCVar4 = *ppCVar20;
        (*(pCVar4->super_Command_Source)._vptr_Command_Source[2])(&str,pCVar4);
        PacketBuilder::AddBreakString(&reply,&str,0xff);
        std::__cxx11::string::~string((string *)&str);
        iVar10 = Character::PlayerID(pCVar4);
        PacketBuilder::AddShort(&reply,iVar10);
        PacketBuilder::AddShort(&reply,(int)pCVar4->mapid);
        PacketBuilder::AddShort(&reply,(uint)pCVar4->x);
        PacketBuilder::AddShort(&reply,(uint)pCVar4->y);
        PacketBuilder::AddChar(&reply,(uint)pCVar4->direction);
        PacketBuilder::AddChar(&reply,6);
        Character::PaddedGuildTag_abi_cxx11_(&str,pCVar4);
        PacketBuilder::AddString(&reply,&str);
        std::__cxx11::string::~string((string *)&str);
        PacketBuilder::AddChar(&reply,(uint)pCVar4->level);
        PacketBuilder::AddChar(&reply,(uint)pCVar4->gender);
        PacketBuilder::AddChar(&reply,(uint)pCVar4->hairstyle);
        PacketBuilder::AddChar(&reply,(uint)pCVar4->haircolor);
        PacketBuilder::AddChar(&reply,(uint)pCVar4->race);
        PacketBuilder::AddShort(&reply,pCVar4->maxhp);
        PacketBuilder::AddShort(&reply,pCVar4->hp);
        PacketBuilder::AddShort(&reply,pCVar4->maxtp);
        PacketBuilder::AddShort(&reply,pCVar4->tp);
        Character::AddPaperdollData(pCVar4,&reply,"B000A0HSW");
        PacketBuilder::AddChar(&reply,(uint)pCVar4->sitting);
        PacketBuilder::AddChar(&reply,pCVar4->hidden & 1);
        PacketBuilder::AddByte(&reply,0xff);
      }
      for (ppNVar19 = updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppNVar19 != ppNVar15;
          ppNVar19 = ppNVar19 + 1) {
        pNVar5 = *ppNVar19;
        if (pNVar5->alive == true) {
          PacketBuilder::AddChar(&reply,(uint)pNVar5->index);
          PacketBuilder::AddShort(&reply,pNVar5->id);
          PacketBuilder::AddChar(&reply,(uint)pNVar5->x);
          PacketBuilder::AddChar(&reply,(uint)pNVar5->y);
          PacketBuilder::AddChar(&reply,(uint)pNVar5->direction);
        }
      }
      PacketBuilder::AddByte(&reply,0xff);
      psVar6 = updateitems.
               super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var23 = &(updateitems.
                       super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
          p_Var23 != &psVar6->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
          p_Var23 = p_Var23 + 1) {
        std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)&str,p_Var23);
        PacketBuilder::AddShort(&reply,(int)*(short *)str._M_dataplus._M_p);
        PacketBuilder::AddShort(&reply,(int)*(short *)(str._M_dataplus._M_p + 2));
        PacketBuilder::AddChar(&reply,(uint)(byte)str._M_dataplus._M_p[8]);
        PacketBuilder::AddChar(&reply,(uint)(byte)str._M_dataplus._M_p[9]);
        PacketBuilder::AddThree(&reply,*(int *)(str._M_dataplus._M_p + 4));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
      }
      Player::Send(player,&reply);
      std::__cxx11::string::~string((string *)&news_file);
      PacketBuilder::~PacketBuilder(&reply);
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
                (&updateitems);
      std::_Vector_base<NPC_*,_std::allocator<NPC_*>_>::~_Vector_base
                (&updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>);
      std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
                (&updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>);
      return;
    }
    if (bVar8) {
LAB_0015420e:
      PacketBuilder::AddByte(&reply,0xff);
    }
    else {
      pcVar12 = fgets(newsbuf,0x1000,__stream);
      if (pcVar12 == (char *)0x0) {
        bVar8 = true;
        goto LAB_0015420e;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1058,newsbuf,&local_1129);
      util::trim(&str,&local_1058);
      std::__cxx11::string::~string((string *)&local_1058);
      while (str._M_string_length < 2) {
        std::__cxx11::string::push_back((char)&str);
      }
      PacketBuilder::ReserveMore(&reply,(str._M_string_length - lVar22) + 9);
      PacketBuilder::AddBreakString(&reply,&str,0xff);
      std::__cxx11::string::~string((string *)&str);
    }
    lVar22 = lVar22 + 1;
  } while( true );
}

Assistant:

void Welcome_Msg(Player *player, PacketReader &reader)
{
	reader.GetThree(); // ??
	/*unsigned int id =*/ reader.GetInt(); // Character ID

	if (!player->character->world->GetMap(player->character->mapid)->exists)
	{
		if (player->character->world->GetMap(player->character->SpawnMap())->exists)
		{
			Console::Wrn("Player logged in to non-existent map (%s, map %i) - Position reset", player->character->real_name.c_str(), player->character->mapid);
			player->character->Warp(player->character->SpawnMap(), player->character->SpawnX(), player->character->SpawnY());
		}
		else
		{
			Console::Wrn("Player logged in to non-existent map (%s, map %i) - Disconnected", player->character->real_name.c_str(), player->character->mapid);
			player->client->Close();
			return;
		}
	}

	player->world->Login(player->character);

	player->client->state = EOClient::Playing;

	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(player->character->map->characters, character)
	{
		if (player->character->InRange(character))
		{
			updatecharacters.push_back(character);
		}
	}

	UTIL_FOREACH(player->character->map->npcs, npc)
	{
		if (player->character->InRange(npc))
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(player->character->map->items, item)
	{
		if (player->character->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 3 + 9);

	reply.AddShort(2); // REPLY_WELCOME sub-id
	// MotDs
	reply.AddByte(255);

	std::string news_file = player->world->config["NewsFile"];

	char newsbuf[4096] = "";
	std::FILE *newsfh = std::fopen(news_file.c_str(), "rt");
	bool newseof = (newsfh == 0);

	if (newseof)
	{
		Console::Wrn("Could not load news file '%s'", news_file.c_str());
	}

	for (int i = 0; i < 9; ++i)
	{
		if (!newseof)
		{
			if (!std::fgets(newsbuf, 4096, newsfh))
			{
				newseof = true;
			}
			else
			{
				std::string str = util::trim(newsbuf);

				while (str.length() < 2)
					str += ' ';

				reply.ReserveMore(str.length() + 9 - i);
				reply.AddBreakString(str);
			}
		}

		if (newseof)
		{
			reply.AddByte(255);
		}
	}

	if (newsfh)
	{
		std::fclose(newsfh);
	}

	reply.ReserveMore(7 + player->character->inventory.size() * 6 + player->character->spells.size() * 4
		+ updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);

	// ??
	reply.AddChar(player->character->weight); // Weight
	reply.AddChar(player->character->maxweight); // Max Weight
	UTIL_FOREACH(player->character->inventory, item)
	{
		reply.AddShort(item.id);
		reply.AddInt(item.amount);
	}
	reply.AddByte(255);
	UTIL_FOREACH(player->character->spells, spell)
	{
		reply.AddShort(spell.id); // Spell ID
		reply.AddShort(spell.level); // Spell Level
	}
	reply.AddByte(255);

	reply.AddChar(updatecharacters.size()); // Number of players
	reply.AddByte(255);
	UTIL_FOREACH(updatecharacters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddShort(character->PlayerID());
		reply.AddShort(character->mapid);
		reply.AddShort(character->x);
		reply.AddShort(character->y);
		reply.AddChar(character->direction);
		reply.AddChar(6); // ?
		reply.AddString(character->PaddedGuildTag());
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddShort(character->maxhp);
		reply.AddShort(character->hp);
		reply.AddShort(character->maxtp);
		reply.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(reply, "B000A0HSW");

		reply.AddChar(character->sitting);
		reply.AddChar(character->IsHideInvisible());
		reply.AddByte(255);
	}
	UTIL_FOREACH(updatenpcs, npc)
	{
		if (npc->alive)
		{
			reply.AddChar(npc->index);
			reply.AddShort(npc->id);
			reply.AddChar(npc->x);
			reply.AddChar(npc->y);
			reply.AddChar(npc->direction);
		}
	}
	reply.AddByte(255);
	UTIL_FOREACH(updateitems, item)
	{
		reply.AddShort(item->uid);
		reply.AddShort(item->id);
		reply.AddChar(item->x);
		reply.AddChar(item->y);
		reply.AddThree(item->amount);
	}
	player->Send(reply);
}